

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O2

ByteSequence * cobs::cobs_encode(ByteSequence *__return_storage_ptr__,ByteSequence *input)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  uchar *puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  uchar local_33;
  undefined1 local_32;
  uchar local_31;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__first._M_current =
            (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start; __first._M_current != puVar2;
      __first._M_current =
           __last._M_current +
           (__last._M_current != puVar2 && (long)_Var1._M_current - (long)__first._M_current < 0xfe)
      ) {
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                      (__first._M_current,puVar2,&local_32);
    __last._M_current = __first._M_current + 0xfe;
    if ((long)_Var1._M_current - (long)__first._M_current < 0xfe) {
      __last = _Var1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_33);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,__first,__last);
    puVar2 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (__first._M_current[-1] == '\0') {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteSequence cobs_encode(const ByteSequence &input)
{
  ByteSequence output;
  auto next_zero_byte = input.begin();
  auto previous_zero_byte = input.begin();

  while(next_zero_byte != input.end() )
  {

    next_zero_byte = std::find(next_zero_byte,
                               input.end(),
                               uint8_t(0));

    auto dist = std::distance(previous_zero_byte,next_zero_byte);

	// clip to  max distance
    dist = dist < 254 ? dist: 254;

    if(dist == 254)	next_zero_byte = previous_zero_byte + 254; 

    output.push_back(dist+1);  // add code byte to output

    output.insert(output.end(), previous_zero_byte, next_zero_byte);  //insert block of bytes between to code bytes , e.g two zeros

    if(   dist != 254
          && next_zero_byte != input.end() )
    {
      std:: advance(next_zero_byte,1);//next_zero_byte++;   // if we found a zero we move iterator to prepare for next std::find
    }

    previous_zero_byte = next_zero_byte;
  }

  if(input[input.size()-1] == uint8_t(0)) output.push_back(uint8_t(1)); // last element is zero , add 1 to output


  return(output);
}